

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

bool __thiscall google::protobuf::internal::ExtensionSet::Extension::IsInitialized(Extension *this)

{
  byte bVar1;
  Arena *pAVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  LogMessage *other;
  Type *pTVar7;
  void *pvVar8;
  LogMessage local_68;
  LogFinisher local_29;
  
  bVar1 = this->type;
  if ((byte)(bVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
               ,0x3c);
    other = LogMessage::operator<<
                      (&local_68,
                       "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=(&local_29,other);
    LogMessage::~LogMessage(&local_68);
  }
  if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) == 10) {
    if (this->is_repeated == true) {
      iVar5 = (int)((this->field_0).string_value)->_M_string_length;
      bVar3 = 0 < iVar5;
      if (0 < iVar5) {
        pTVar7 = RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                           ((RepeatedPtrFieldBase *)(this->field_0).string_value,0);
        iVar5 = (*pTVar7->_vptr_MessageLite[6])(pTVar7);
        if ((char)iVar5 != '\0') {
          iVar5 = 1;
          do {
            iVar6 = (int)((this->field_0).string_value)->_M_string_length;
            bVar3 = iVar5 < iVar6;
            if (iVar6 <= iVar5) {
              return true;
            }
            pTVar7 = RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                               ((RepeatedPtrFieldBase *)(this->field_0).string_value,iVar5);
            iVar6 = (*pTVar7->_vptr_MessageLite[6])(pTVar7);
            iVar5 = iVar5 + 1;
          } while ((char)iVar6 != '\0');
        }
        if (bVar3) {
          return false;
        }
      }
    }
    else if ((this->field_0xa & 1) == 0) {
      pAVar2 = (((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_;
      if ((this->field_0xa & 0x10) == 0) {
        cVar4 = (*(code *)(pAVar2->impl_).options_.max_block_size)();
      }
      else {
        pvVar8 = (*(pAVar2->impl_).options_.block_alloc)
                           ((size_t)(this->field_0).repeated_string_value);
        cVar4 = (char)pvVar8;
      }
      if (cVar4 == '\0') {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool ExtensionSet::Extension::IsInitialized() const {
  if (cpp_type(type) == WireFormatLite::CPPTYPE_MESSAGE) {
    if (is_repeated) {
      for (int i = 0; i < repeated_message_value->size(); i++) {
        if (!repeated_message_value->Get(i).IsInitialized()) {
          return false;
        }
      }
    } else {
      if (!is_cleared) {
        if (is_lazy) {
          if (!lazymessage_value->IsInitialized()) return false;
        } else {
          if (!message_value->IsInitialized()) return false;
        }
      }
    }
  }
  return true;
}